

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::ServiceDescriptorProto::SharedDtor(MessageLite *self)

{
  ServiceOptions *this;
  ulong uVar1;
  LogMessageFatal local_20;
  
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 3));
    this = (ServiceOptions *)self[3]._internal_metadata_.ptr_;
    if (this != (ServiceOptions *)0x0) {
      ServiceOptions::~ServiceOptions(this);
    }
    operator_delete(this,0x58);
    RepeatedPtrField<google::protobuf::MethodDescriptorProto>::~RepeatedPtrField
              ((RepeatedPtrField<google::protobuf::MethodDescriptorProto> *)
               &self[1]._internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x1c6a,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void ServiceDescriptorProto::SharedDtor(MessageLite& self) {
  ServiceDescriptorProto& this_ = static_cast<ServiceDescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  delete this_._impl_.options_;
  this_._impl_.~Impl_();
}